

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O2

ebml_string * Copy(ebml_string *Element)

{
  size_t __size;
  long lVar1;
  filepos_t fVar2;
  ebml_string *p;
  char *__dest;
  ebml_string *peVar3;
  
  p = (ebml_string *)EBML_ElementCreate(Element,(Element->Base).Context,0,-1);
  peVar3 = (ebml_string *)0x0;
  if (p != (ebml_string *)0x0) {
    lVar1 = (Element->Base).DataSize;
    __size = lVar1 + 1;
    __dest = (char *)malloc(__size);
    p->Buffer = __dest;
    if (__dest == (char *)0x0) {
      NodeDelete((node *)p);
      peVar3 = (ebml_string *)0x0;
    }
    else {
      strncpy(__dest,Element->Buffer,__size);
      (p->Base).bValueIsSet = (Element->Base).bValueIsSet;
      (p->Base).DataSize = lVar1;
      (p->Base).ElementPosition = (Element->Base).ElementPosition;
      (p->Base).SizeLength = (Element->Base).SizeLength;
      fVar2 = (Element->Base).EndPosition;
      (p->Base).SizePosition = (Element->Base).SizePosition;
      (p->Base).EndPosition = fVar2;
      (p->Base).bNeedDataSizeUpdate = (Element->Base).bNeedDataSizeUpdate;
      peVar3 = p;
    }
  }
  return peVar3;
}

Assistant:

static ebml_element *Copy(const ebml_master *Element)
{
    ebml_element *i, *Elt;
    ebml_master *Result = (ebml_master*)EBML_ElementCreate(Element,Element->Base.Context,0,EBML_ANY_PROFILE);
    if (Result)
    {
        EBML_MasterErase(Result); // delete the children elements created by default
        Result->Base.bValueIsSet = Element->Base.bValueIsSet;
        Result->Base.DataSize = Element->Base.DataSize;
        Result->Base.ElementPosition = Element->Base.ElementPosition;
        Result->Base.SizeLength = Element->Base.SizeLength;
        Result->Base.SizePosition = Element->Base.SizePosition;
        Result->Base.EndPosition = Element->Base.EndPosition;
        Result->Base.bNeedDataSizeUpdate = Element->Base.bNeedDataSizeUpdate;
        Result->CheckSumStatus = Element->CheckSumStatus;
        for (i=EBML_MasterChildren(Element);i;i=EBML_MasterNext(i))
        {
            Elt = EBML_ElementCopy(i);
            if (!Elt || EBML_MasterAppend(Result, Elt)!=ERR_NONE)
            {
                NodeDelete((node*)Result);
                Result = NULL;
                break;
            }
        }
    }
    return (ebml_element*)Result;
}